

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

Atom * __thiscall r_code::vector<r_code::Atom>::operator[](vector<r_code::Atom> *this,size_t i)

{
  pointer pAVar1;
  ulong uVar2;
  
  pAVar1 = (this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 2;
  if (uVar2 <= i) {
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::resize(&this->m_vector,i + 1);
    pAVar1 = (this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 2;
  }
  if (i < uVar2) {
    return pAVar1 + i * 4;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }